

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::convertFromXYZFloat
               (float *out,float *in,uint w,uint h,LodePNGState *state,float *whitepoint,
               uint rendering_intent)

{
  long in_R8;
  LodePNGICC icc;
  uint use_icc;
  LodePNGInfo *info;
  uint error;
  LodePNGICC *in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffeac;
  LodePNGInfo *in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  float *in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  LodePNGInfo *in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float *in_stack_ffffffffffffff00;
  float *in_stack_ffffffffffffff08;
  LodePNGICC *in_stack_ffffffffffffff20;
  float *in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff30;
  uint local_2c;
  
  lodepng_icc_init((LodePNGICC *)0x142622);
  if (*(int *)(in_R8 + 0x1a8) != 0) {
    local_2c = parseICC((LodePNGICC *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                        (uchar *)in_stack_fffffffffffffef0,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (local_2c != 0) goto LAB_0014271a;
    validateICC((LodePNGICC *)&stack0xfffffffffffffe98);
  }
  local_2c = convertFromXYZ_chrm(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                 (uint)in_stack_fffffffffffffefc,(uint)in_stack_fffffffffffffef8,
                                 in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                                 (uint)in_stack_ffffffffffffff30);
  if (local_2c == 0) {
    convertFromXYZ_gamma
              (in_stack_fffffffffffffec0,(uint)in_stack_fffffffffffffebc,
               (uint)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               (uint)in_stack_fffffffffffffeac,in_stack_fffffffffffffea0);
  }
LAB_0014271a:
  lodepng_icc_cleanup((LodePNGICC *)0x142724);
  return local_2c;
}

Assistant:

unsigned convertFromXYZFloat(float* out, const float* in, unsigned w, unsigned h,
                             const LodePNGState* state,
                             const float whitepoint[3], unsigned rendering_intent) {
  unsigned error = 0;
  const LodePNGInfo* info = &state->info_png;

  /* parse ICC if present */
  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }

  /* Handle gamut */
  error = convertFromXYZ_chrm(out, in, w, h, info, use_icc, &icc, whitepoint, rendering_intent);
  if(error) goto cleanup;

  /* Handle transfer function */
  convertFromXYZ_gamma(out, w, h, info, use_icc, &icc);

cleanup:
  lodepng_icc_cleanup(&icc);
  return error;
}